

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteFile(ColladaExporter *this)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  ostream *poVar4;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  puVar1 = &this->field_0x38;
  poVar4 = std::operator<<((ostream *)puVar1,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>");
  psVar2 = &this->endstr;
  std::operator<<(poVar4,(string *)psVar2);
  poVar4 = std::operator<<((ostream *)puVar1,
                           "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">"
                          );
  std::operator<<(poVar4,(string *)psVar2);
  PushTag(this);
  WriteTextures(this);
  WriteHeader(this);
  WriteCamerasLibrary(this);
  WriteLightsLibrary(this);
  WriteMaterials(this);
  WriteGeometryLibrary(this);
  WriteControllerLibrary(this);
  WriteSceneLibrary(this);
  WriteAnimationsLibrary(this);
  psVar3 = &this->startstr;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"<scene>");
  std::operator<<(poVar4,(string *)psVar2);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar3);
  std::__cxx11::string::string((string *)&local_50,(this->mScene->mRootNode->mName).data,&local_b1);
  XMLEscape(&local_b0,&local_50);
  std::operator+(&local_90,"<instance_visual_scene url=\"#",&local_b0);
  std::operator+(&local_70,&local_90,"\" />");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  std::operator<<(poVar4,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"</scene>");
  std::operator<<(poVar4,(string *)psVar2);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,"</COLLADA>");
  std::operator<<(poVar4,(string *)psVar2);
  return;
}

Assistant:

void ColladaExporter::WriteFile() {
    // write the DTD
    mOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>" << endstr;
    // COLLADA element start
    mOutput << "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">" << endstr;
    PushTag();

    WriteTextures();
    WriteHeader();

    WriteCamerasLibrary();
    WriteLightsLibrary();
    WriteMaterials();
    WriteGeometryLibrary();
    WriteControllerLibrary();

    WriteSceneLibrary();
	
	// customized, Writes the animation library
	WriteAnimationsLibrary();

    // useless Collada fu at the end, just in case we haven't had enough indirections, yet.
    mOutput << startstr << "<scene>" << endstr;
    PushTag();
    mOutput << startstr << "<instance_visual_scene url=\"#" + XMLEscape(mScene->mRootNode->mName.C_Str()) + "\" />" << endstr;
    PopTag();
    mOutput << startstr << "</scene>" << endstr;
    PopTag();
    mOutput << "</COLLADA>" << endstr;
}